

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::GetSelectedCommissioner
          (Error *__return_storage_ptr__,JobManager *this,CommissionerAppPtr *aCommissioner)

{
  CommissionerPool *this_00;
  ErrorCode EVar1;
  Status SVar2;
  char *begin;
  char *pcVar3;
  iterator iVar4;
  Error *pEVar5;
  __shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint64_t nid;
  CommissionerAppPtr commissioner;
  undefined1 local_150 [40];
  Config conf;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  SVar2 = persistent_storage::Registry::GetCurrentNetworkXpan
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&nid);
  if (SVar2 == kSuccess) {
    if (nid == 0) {
      p_Var6 = &(this->mDefaultCommissioner).
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>;
    }
    else {
      this_00 = &this->mCommissionerPool;
      iVar4 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
              ::find(&this_00->_M_t,&nid);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header) {
        Config::Config(&conf,&this->mDefaultConf);
        commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        PrepareDtlsConfig((Error *)local_150,this,nid,&conf);
        pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_150);
        EVar1 = pEVar5->mCode;
        std::__cxx11::string::~string((string *)(local_150 + 8));
        if (EVar1 == kNone) {
          CommissionerAppCreate((Error *)local_150,&commissioner,&conf);
          pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_150);
          EVar1 = pEVar5->mCode;
          std::__cxx11::string::~string((string *)(local_150 + 8));
          if (EVar1 == kNone) {
            p_Var6 = &std::
                      map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                      ::operator[](this_00,&nid)->
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>::
            operator=(p_Var6,&commissioner.
                              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     );
            p_Var6 = &std::
                      map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                      ::operator[](this_00,&nid)->
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>::
            operator=(&aCommissioner->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                      ,p_Var6);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&commissioner.
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        Config::~Config(&conf);
        return __return_storage_ptr__;
      }
      p_Var6 = (__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2> *)
               &iVar4._M_node[1]._M_parent;
    }
    std::__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&aCommissioner->
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>,
               p_Var6);
  }
  else {
    conf.mEnableCcm = false;
    conf._1_3_ = 0;
    conf._8_8_ = anon_var_dwarf_3ce1e;
    conf.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x1f;
    conf.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    conf.mDomainName._M_dataplus._M_p = (pointer)0x0;
    pcVar3 = "getting selected network failed";
    conf._32_8_ = &conf;
    while (begin = pcVar3, begin != "") {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)&conf);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&conf;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&commissioner,(v10 *)"getting selected network failed",
               (string_view)ZEXT816(0x1f),args);
    local_150._0_4_ = kRegistryError;
    std::__cxx11::string::string((string *)(local_150 + 8),(string *)&commissioner);
    Error::operator=(__return_storage_ptr__,(Error *)local_150);
    std::__cxx11::string::~string((string *)(local_150 + 8));
    std::__cxx11::string::~string((string *)&commissioner);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::GetSelectedCommissioner(CommissionerAppPtr &aCommissioner)
{
    Error          error = ERROR_NONE;
    uint64_t       nid;
    RegistryStatus status;

    status = mInterpreter.mRegistry->GetCurrentNetworkXpan(nid);
    VerifyOrExit(RegistryStatus::kSuccess == status, error = ERROR_REGISTRY_ERROR("getting selected network failed"));

    if (nid != 0)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry != mCommissionerPool.end())
        {
            aCommissioner = entry->second;
        }
        else
        {
            Config             conf         = mDefaultConf;
            CommissionerAppPtr commissioner = nullptr;

            SuccessOrExit(error = PrepareDtlsConfig(nid, conf));
            SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
            mCommissionerPool[nid] = commissioner;
            aCommissioner          = mCommissionerPool[nid];
        }
    }
    else
    {
        aCommissioner = mDefaultCommissioner;
    }
exit:
    return error;
}